

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,int other)

{
  undefined8 extraout_RAX;
  undefined8 uVar1;
  size_t extraout_RAX_00;
  size_t sVar2;
  size_t extraout_RAX_01;
  RangeValue RVar3;
  RangeValue retval;
  RangeValue local_30;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (this->_isUnbound == true) {
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_20._isUnbound);
    goto LAB_002657e3;
  }
  if (other < 0) {
    RangeValue(&local_30);
    sVar2 = extraout_RAX_01;
    if (this->_isUnbound == false) {
      local_30._val = (ulong)(uint)-other + this->_val;
      goto LAB_002657d5;
    }
  }
  else {
    RangeValue(&local_30);
    sVar2 = extraout_RAX_00;
    if (this->_isUnbound == false) {
      sVar2 = this->_val - (ulong)(uint)other;
      local_30._val = sVar2;
      if (this->_val < (ulong)(uint)other) {
        local_30._val = 0;
      }
LAB_002657d5:
      local_30._isUnbound = false;
    }
  }
  uVar1 = CONCAT71((int7)(sVar2 >> 8),local_30._isUnbound);
  local_20._val = local_30._val;
LAB_002657e3:
  RVar3._val = local_20._val;
  RVar3._0_8_ = uVar1;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator- (int other) const {
    RangeValue retval;
    if (_isUnbound)
        return retval;
    else if (other < 0) {
        return (*this) + static_cast<size_t>(-1*other);
    }
    else
        return (*this) - static_cast<size_t>(other);
}